

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.hpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::BindingSamplerArrayTest::~BindingSamplerArrayTest
          (BindingSamplerArrayTest *this)

{
  (this->super_GLSLTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__BindingSamplerArrayTest_020dbdf8;
  Utils::texture::release(&this->m_goku_06_texture);
  Utils::texture::release(&this->m_goku_05_texture);
  Utils::texture::release(&this->m_goku_04_texture);
  Utils::texture::release(&this->m_goku_03_texture);
  Utils::texture::release(&this->m_goku_02_texture);
  Utils::texture::release(&this->m_goku_01_texture);
  Utils::texture::release(&this->m_goku_00_texture);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

virtual ~BindingSamplerArrayTest()
	{
	}